

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

_Bool Check_Char(FIELDTYPE *typ,int ch,TypeArgument *argp)

{
  _Bool _Var1;
  ushort **ppuVar2;
  _Bool local_29;
  TypeArgument *argp_local;
  int ch_local;
  FIELDTYPE *typ_local;
  
  if (typ != (FIELDTYPE *)0x0) {
    if ((typ->status & 1) != 0) {
      if (argp != (TypeArgument *)0x0) {
        _Var1 = Check_Char(typ->left,ch,argp->left);
        local_29 = true;
        if (!_Var1) {
          local_29 = Check_Char(typ->right,ch,argp->right);
        }
        return local_29;
      }
      __assert_fail("argp != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CursesDialog/form/frm_driver.c"
                    ,0x335,"_Bool Check_Char(FIELDTYPE *, int, TypeArgument *)");
    }
    if (typ->ccheck != (_func__Bool_int_void_ptr *)0x0) {
      _Var1 = (*typ->ccheck)(ch,argp);
      return _Var1;
    }
  }
  ppuVar2 = __ctype_b_loc();
  return ((*ppuVar2)[(int)(ch & 0xff)] & 0x4000) != 0;
}

Assistant:

static bool Check_Char(FIELDTYPE * typ, int ch, TypeArgument *argp)
{
  if (typ) 
    {
      if (typ->status & _LINKED_TYPE)
        {
          assert(argp != 0);
          return(
            Check_Char(typ->left ,ch,argp->left ) ||
            Check_Char(typ->right,ch,argp->right) );
        } 
      else 
        {
          if (typ->ccheck)
            return typ->ccheck(ch,(void *)argp);
        }
    }
  return (isprint((unsigned char)ch) ? TRUE : FALSE);
}